

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.hpp
# Opt level: O2

bool boost::spirit::karma::
     any_binary_generator<boost::spirit::karma::detail::integer<16>,(boost::spirit::endian::endianness)0,16>
     ::
     generate<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,unsigned_short>
               (output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                *sink,unused_type *context,unused_type *d,unsigned_short *attr)

{
  long lVar1;
  endian<(boost::spirit::endian::endianness)0,_unsigned_short,_16UL,_(boost::spirit::endian::alignment)0>
  p;
  uchar local_12 [2];
  
  for (lVar1 = 0; (int)lVar1 != 2; lVar1 = lVar1 + 1) {
    detail::
    output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>
    ::operator=((output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>
                 *)sink,local_12 + lVar1);
  }
  return true;
}

Assistant:

static bool generate(OutputIterator& sink, Context& context
          , Delimiter const& d, Attribute const& attr)
        {
            if (!traits::has_optional_value(attr))
                return false;

            // Even if the endian types are not pod's (at least not in the
            // definition of C++03) it seems to be safe to assume they are.
            // This allows us to treat them as a sequence of consecutive bytes.
            boost::endian::endian<endian, typename T::type, bits> p;

#if defined(BOOST_MSVC)
// warning C4244: 'argument' : conversion from 'const int' to 'foo', possible loss of data
#pragma warning(push)
#pragma warning(disable: 4244)
#endif
            typedef typename T::type attribute_type;
            p = traits::extract_from<attribute_type>(attr, context);
#if defined(BOOST_MSVC)
#pragma warning(pop)
#endif

            unsigned char const* bytes =
                reinterpret_cast<unsigned char const*>(&p);

            for (unsigned int i = 0; i < sizeof(p); ++i)
            {
                if (!detail::generate_to(sink, *bytes++))
                    return false;
            }
            return karma::delimit_out(sink, d);     // always do post-delimiting
        }